

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Image::Image(Image *this,Image *param_1)

{
  int iVar1;
  Image *param_1_local;
  Image *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  iVar1 = param_1->height;
  this->width = param_1->width;
  this->height = iVar1;
  iVar1 = param_1->bits;
  this->component = param_1->component;
  this->bits = iVar1;
  this->pixel_type = param_1->pixel_type;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->image,&param_1->image);
  this->bufferView = param_1->bufferView;
  std::__cxx11::string::string((string *)&this->mimeType,(string *)&param_1->mimeType);
  std::__cxx11::string::string((string *)&this->uri,(string *)&param_1->uri);
  Value::Value(&this->extras,&param_1->extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&param_1->extensions);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  this->as_is = (bool)(param_1->as_is & 1);
  return;
}

Assistant:

Image() = default;